

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::sync_log_to_new_srv(raft_server *this,ulong start_idx)

{
  uint uVar1;
  int32 iVar2;
  int32 iVar3;
  element_type *peVar4;
  element_type *peVar5;
  pointer pcVar6;
  element_type *peVar7;
  __int_type_conflict _Var8;
  __int_type_conflict _Var9;
  undefined4 uVar10;
  undefined8 uVar11;
  int iVar12;
  undefined8 uVar13;
  ulong uVar14;
  _func_int **pp_Var15;
  _Node *p_Var16;
  long lVar17;
  size_t sVar18;
  element_type *peVar19;
  snapshot_io_mgr *this_00;
  req_msg *__tmp;
  _Atomic_word *__position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar20;
  bool bVar21;
  ptr<cluster_config> cur_conf;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> new_conf;
  ptr<log_entry> entry;
  ptr<raft_params> params;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar22;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  undefined1 local_80 [22];
  log_val_type local_6a;
  undefined1 local_69;
  ptr<log_entry> local_68;
  undefined1 local_58 [32];
  log_val_type local_38 [8];
  unsigned_long local_30;
  
  uVar22 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar4 != (element_type *)0x0) &&
     (iVar12 = (**(code **)(*(long *)peVar4 + 0x38))(), 4 < iVar12)) {
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_;
    uVar13 = (**(code **)(*(long *)(this->log_store_).
                                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0x18))();
    msg_if_given_abi_cxx11_
              ((string *)local_a8,"[SYNC LOG] peer %d start idx %lu, my log start idx %lu",
               (ulong)uVar1,start_idx,uVar13);
    (**(code **)(*(long *)peVar4 + 0x40))
              (peVar4,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
               ,"sync_log_to_new_srv",0xd8,(string *)local_a8);
    if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  if (start_idx < (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
    uVar20 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i - start_idx;
  }
  else {
    uVar20 = 0;
  }
  context::get_params((context *)local_58);
  iVar12 = *(int *)(local_58._0_8_ + 0x14);
  if ((iVar12 == 0) || (0 < iVar12 && uVar20 < (ulong)(long)iVar12)) {
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar4 != (element_type *)0x0) &&
       (iVar12 = (**(code **)(*(long *)peVar4 + 0x38))(), 3 < iVar12)) {
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a8,
                 "[SYNC LOG] LogSync is done for server %d with log gap %lu (%lu - %lu, limit %d), now put the server into cluster"
                 ,(ulong)(uint)((((this->srv_to_join_).
                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,uVar20,
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,start_idx,
                 CONCAT44(uVar22,*(undefined4 *)(local_58._0_8_ + 0x14)));
      (**(code **)(*(long *)peVar4 + 0x40))
                (peVar4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"sync_log_to_new_srv",0xe6,local_a8);
      if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    get_config((raft_server *)local_b8);
    if ((this->uncommitted_config_).
        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 != (element_type *)0x0) &&
         (iVar12 = (**(code **)(*(long *)peVar4 + 0x38))(), 3 < iVar12)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar5 = (this->uncommitted_config_).
                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"uncommitted config exists at log %lu, prev log %lu",
                   peVar5->log_idx_,peVar5->prev_log_idx_);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"sync_log_to_new_srv",0xf0,local_a8);
        if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      local_b8._0_8_ =
           (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    pp_Var15 = (_func_int **)
               (**(code **)(*(long *)(this->log_store_).
                                     super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 0x10))();
    uVar22 = *(undefined4 *)(ulong *)local_b8._0_8_;
    uVar10 = *(undefined4 *)((long)(ulong *)local_b8._0_8_ + 4);
    local_80._0_8_ = (EventAwaiter *)0x0;
    local_80._8_8_ = operator_new(0x60);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005b2ae8;
    local_80._0_8_ = local_80._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x10))->
    _vptr__Sp_counted_base = pp_Var15;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x10))->_M_use_count = uVar22
    ;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x10))->_M_weak_count =
         uVar10;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x20))->
      _vptr__Sp_counted_base = 0;
    *(_Atomic_word **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x20))->_M_use_count =
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x30))->_M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x30))->_M_use_count = 0;
    __position = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x40))->
                  _M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x40))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x40))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)__position;
    *(_Atomic_word **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x40))->_M_use_count =
         __position;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x50))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_80._8_8_ + 0x50))->_M_weak_count = 0;
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>::
    insert<std::_List_iterator<std::shared_ptr<nuraft::srv_config>>,void>
              ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                *)__position,(const_iterator)__position,
               (((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  *)(local_b8._0_8_ + 0x38))->
               super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
               )._M_impl._M_node.super__List_node_base._M_next,
               (_List_node_base *)(local_b8._0_8_ + 0x38));
    uVar13 = local_80._0_8_;
    p_Var16 = std::__cxx11::
              list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
              ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                        ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                          *)(local_80._0_8_ + 0x38),&this->conf_to_add_);
    std::__detail::_List_node_base::_M_hook(&p_Var16->super__List_node_base);
    uVar11 = local_80._0_8_;
    *(size_t *)(uVar13 + 0x48) = *(size_t *)(uVar13 + 0x48) + 1;
    pcVar6 = (((string *)(local_b8._0_8_ + 0x18))->_M_dataplus)._M_p;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar6,
               pcVar6 + ((string *)(local_b8._0_8_ + 0x18))->_M_string_length);
    std::__cxx11::string::_M_assign((string *)(uVar11 + 0x18));
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_);
    }
    *(bool *)(local_80._0_8_ + 0x10) = *(bool *)(local_b8._0_8_ + 0x10);
    cluster_config::serialize((cluster_config *)local_a8);
    local_30 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_6a = conf;
    lVar17 = std::chrono::_V2::system_clock::now();
    local_38 = (log_val_type  [8])(lVar17 / 1000);
    local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_68,(allocator<nuraft::log_entry> *)&local_69,
               &local_30,(shared_ptr<nuraft::buffer> *)local_a8,&local_6a,(unsigned_long *)local_38)
    ;
    store_log_entry(this,&local_68,0);
    this->config_changing_ = true;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_80._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    request_append_entries(this);
    if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
    if (local_a8._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
    }
  }
  else {
    local_b8._0_8_ = (element_type *)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    uVar14 = (**(code **)(*(long *)(this->log_store_).
                                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0x18))();
    if (start_idx < uVar14) {
      LOCK();
      (this->srv_to_join_snp_retry_required_)._M_base._M_i = false;
      UNLOCK();
      local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
      create_sync_snapshot_req
                ((raft_server *)local_a8,(ptr<peer> *)this,(ulong)&this->srv_to_join_,start_idx,
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i,
                 (bool *)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i);
      uVar11 = local_a8._8_8_;
      local_b8._0_8_ = local_a8._0_8_;
      uVar13 = local_b8._8_8_;
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = 0;
      local_b8._8_8_ = uVar11;
      if ((element_type *)uVar13 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13);
      }
      if (local_a8._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      if (local_80[0] == '\0') {
        LOCK();
        (this->srv_to_join_snp_retry_required_)._M_base._M_i = true;
        UNLOCK();
        enable_hb_for_peer(this,(this->srv_to_join_).
                                super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        goto LAB_001c4cd7;
      }
    }
    else {
      uVar14 = (long)*(int *)(local_58._0_8_ + 0x10);
      if (uVar20 < (ulong)(long)*(int *)(local_58._0_8_ + 0x10)) {
        uVar14 = uVar20;
      }
      peVar7 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (**(code **)(*(long *)peVar7 + 0x60))(local_a8 + 0x28,peVar7,start_idx,uVar14 & 0xffffffff);
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 != (element_type *)0x0) &&
         (iVar12 = (**(code **)(*(long *)peVar4 + 0x38))(), 4 < iVar12)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        sVar18 = buffer::size((buffer *)local_80._0_8_);
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"size to sync: %d, log_pack size %zu\n",uVar14 & 0xffffffff,
                   sVar18);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"sync_log_to_new_srv",0x123,local_a8);
        if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      _Var8 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      iVar2 = ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->id_;
      _Var9 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      peVar19 = (element_type *)operator_new(0x60);
      uVar13 = local_b8._8_8_;
      (peVar19->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x100000001;
      peVar19->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b23c0;
      local_b8._0_8_ =
           &(peVar19->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      iVar3 = this->id_;
      (peVar19->bg_commit_thread_)._M_id._M_thread = _Var8;
      *(undefined4 *)&(peVar19->bg_append_thread_)._M_id._M_thread = 10;
      *(int32 *)((long)&(peVar19->bg_append_thread_)._M_id._M_thread + 4) = iVar3;
      *(int32 *)&peVar19->bg_append_ea_ = iVar2;
      (peVar19->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005b2410;
      *(undefined8 *)&(peVar19->initialized_)._M_base = 0;
      *(ulong *)&peVar19->id_ = start_idx - 1;
      *(__int_type_conflict *)&peVar19->target_priority_ = _Var9;
      (peVar19->priority_change_timer_).t_created_.__d.__r = 0;
      (peVar19->priority_change_timer_).duration_us_ = 0;
      *(undefined8 *)&(peVar19->priority_change_timer_).first_event_fired_ = 0;
      bVar21 = (element_type *)local_b8._8_8_ != (element_type *)0x0;
      local_b8._8_8_ = peVar19;
      if (bVar21) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13);
      }
      uVar13 = local_b8._0_8_;
      local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_38[0] = 4;
      local_a8._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),(log_entry **)local_a8
                 ,(allocator<nuraft::log_entry> *)&local_30,(unsigned_long *)&local_68,
                 (shared_ptr<nuraft::buffer> *)(local_a8 + 0x28),local_38);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
      ::emplace_back<std::shared_ptr<nuraft::log_entry>>
                ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                  *)(uVar13 + 0x38),(shared_ptr<nuraft::log_entry> *)local_a8);
      if (local_a8._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
    }
    if (*(char *)(local_58._0_8_ + 100) != '\0') {
      this_00 = snapshot_io_mgr::instance();
      snapshot_io_mgr::invoke(this_00);
      goto LAB_001c4cd7;
    }
    local_58._16_8_ =
         (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._24_8_ =
         (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_)->_M_use_count + 1;
      }
    }
    peer::send_req((peer *)local_58._16_8_,(ptr<peer> *)(local_58 + 0x10),(ptr<req_msg> *)local_b8,
                   &this->ex_resp_handler_);
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
LAB_001c4cd7:
  if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void raft_server::sync_log_to_new_srv(ulong start_idx) {
    p_db("[SYNC LOG] peer %d start idx %" PRIu64 ", my log start idx %" PRIu64,
         srv_to_join_->get_id(), start_idx, log_store_->start_index());
    // only sync committed logs
    ulong gap = ( quick_commit_index_ > start_idx )
                ? ( quick_commit_index_ - start_idx )
                : 0;
    ptr<raft_params> params = ctx_->get_params();
    if ( ( params->log_sync_stop_gap_ > 0 &&
           gap < (ulong)params->log_sync_stop_gap_ ) ||
         params->log_sync_stop_gap_ == 0 ) {
        p_in( "[SYNC LOG] LogSync is done for server %d "
              "with log gap %" PRIu64 " (%" PRIu64 " - %" PRIu64 ", limit %d), "
              "now put the server into cluster",
              srv_to_join_->get_id(),
              gap, quick_commit_index_.load(), start_idx,
              params->log_sync_stop_gap_ );

        ptr<cluster_config> cur_conf = get_config();

        // WARNING:
        //   If there is any uncommitted changed config,
        //   new config should be generated on top of it.
        if (uncommitted_config_) {
            p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
                 uncommitted_config_->get_log_idx(),
                 uncommitted_config_->get_prev_log_idx());
            cur_conf = uncommitted_config_;
        }

        ptr<cluster_config> new_conf = cs_new<cluster_config>
                                       ( log_store_->next_slot(),
                                         cur_conf->get_log_idx() );
        new_conf->get_servers().insert( new_conf->get_servers().end(),
                                        cur_conf->get_servers().begin(),
                                        cur_conf->get_servers().end() );
        new_conf->get_servers().push_back(conf_to_add_);
        new_conf->set_user_ctx( cur_conf->get_user_ctx() );
        new_conf->set_async_replication
                  ( cur_conf->is_async_replication() );

        ptr<buffer> new_conf_buf(new_conf->serialize());
        ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                                 new_conf_buf,
                                                 log_val_type::conf,
                                                 timer_helper::get_timeofday_us() ) );
        store_log_entry(entry);
        config_changing_ = true;
        uncommitted_config_ = new_conf;
        request_append_entries();
        return;
    }

    ptr<req_msg> req;

    // Modified by Jung-Sang Ahn, 12/22, 2017.
    // When snapshot transmission is still in progress, start_idx can be 0.
    // We should tolerate this.
    if (/* start_idx > 0 && */ start_idx < log_store_->start_index()) {
        srv_to_join_snp_retry_required_ = false;
        bool succeeded_out = false;
        req = create_sync_snapshot_req( srv_to_join_,
                                        start_idx,
                                        state_->get_term(),
                                        quick_commit_index_,
                                        succeeded_out );
        if (!succeeded_out) {
            // If reading snapshot fails, enable HB temporarily to retry it.
            srv_to_join_snp_retry_required_ = true;
            enable_hb_for_peer(*srv_to_join_);
            return;
        }

    } else {
        int32 size_to_sync = std::min(gap, (ulong)params->log_sync_batch_size_);
        ptr<buffer> log_pack = log_store_->pack(start_idx, size_to_sync);
        p_db( "size to sync: %d, log_pack size %zu\n",
              size_to_sync, log_pack->size() );
        req = cs_new<req_msg>( state_->get_term(),
                               msg_type::sync_log_request,
                               id_,
                               srv_to_join_->get_id(),
                               0L,
                               start_idx - 1,
                               quick_commit_index_.load() );
        req->log_entries().push_back
            ( cs_new<log_entry>
              ( state_->get_term(), log_pack, log_val_type::log_pack) );
    }

    if (!params->use_bg_thread_for_snapshot_io_) {
        // Synchronous IO: directly send here.
        srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    } else {
        // Asynchronous IO: invoke the thread.
        snapshot_io_mgr::instance().invoke();
    }
}